

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.h
# Opt level: O2

cookie * warhawk::common::cookie::parse(cookie *__return_storage_ptr__,string *n_)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long_long uVar4;
  invalid_argument *this;
  char cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  cookie(__return_storage_ptr__);
  cVar5 = (char)n_;
  uVar2 = std::__cxx11::string::find(cVar5,0x3d);
  uVar3 = std::__cxx11::string::find(cVar5,9);
  if (uVar3 < uVar2) {
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::find(cVar5,9);
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
    bVar1 = std::operator!=(&bStack_48,"FALSE");
    __return_storage_ptr__->m_include_sub = bVar1;
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::find(cVar5,9);
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_path,(string *)&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::find(cVar5,9);
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
    bVar1 = std::operator!=(&bStack_48,"FALSE");
    __return_storage_ptr__->m_secure = bVar1;
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::find(cVar5,9);
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
    uVar4 = std::__cxx11::stoull(&bStack_48,(size_t *)0x0,10);
    __return_storage_ptr__->m_expires = uVar4;
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::find(cVar5,9);
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_name,(string *)&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
  }
  else {
    if (uVar2 == 0xffffffffffffffff) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Unknown format");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_name,(string *)&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)n_);
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_value,(string *)&bStack_48);
  std::__cxx11::string::~string((string *)&bStack_48);
  return __return_storage_ptr__;
}

Assistant:

static cookie parse( const std::string &n_ )
  {
    cookie res;
    auto peq  = n_.find( '='  );
    auto ptab = n_.find( '\t' );

    if ( ptab < peq )
    {
      // Netscape
      res.m_domain = n_.substr( 0, ptab );
      auto start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_include_sub = n_.substr( start, ptab - start ) != "FALSE";
      start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_path = n_.substr( start, ptab - start );
      start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_secure = n_.substr( ptab, ptab - start ) != "FALSE";
      start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_expires = std::stoull( n_.substr( start, ptab - start ) );
      start = ptab + 1;
      ptab = n_.find( '\t', start );
      res.m_name = n_.substr( start, ptab - start );
      start = ptab + 1;
      res.m_value = n_.substr( start );
    }
    else
    {
      if ( peq == std::string::npos )
      {
        throw std::invalid_argument( "Unknown format" );
      }

      res.m_name  = n_.substr( 0, peq );
      res.m_value = n_.substr( peq + 1 );
    }

    return res;
  }